

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt5
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  byte bVar1;
  ushort uVar2;
  params *ppVar3;
  color_quad_u8 *pcVar4;
  uint8 *puVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ushort uVar24;
  bool bVar25;
  ulong uVar26;
  ulong uVar27;
  uint64 DD [8];
  uint64 D2 [8];
  uint64 hist [8];
  uint values [8];
  uint16 solutions [529];
  ulong local_538 [28];
  undefined8 local_458;
  
  uVar12 = (uint)(low_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar12) {
    uVar12 = 0xff;
  }
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  uVar16 = (uint)(high_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar16) {
    uVar16 = 0xff;
  }
  if ((int)uVar16 < 1) {
    uVar16 = 0;
  }
  local_538[0x16] = 0;
  local_538[0x17] = 0;
  local_538[0x14] = 0;
  local_538[0x15] = 0;
  local_538[0x12] = 0;
  local_538[0x13] = 0;
  local_538[0x10] = 0;
  local_538[0x11] = 0;
  local_538[0xe] = 0;
  local_538[0xf] = 0;
  local_538[0xc] = 0;
  local_538[0xd] = 0;
  local_538[10] = 0;
  local_538[0xb] = 0;
  local_538[8] = 0;
  local_538[9] = 0;
  local_538[6] = 0;
  local_538[7] = 0;
  local_538[4] = 0;
  local_538[5] = 0;
  local_538[2] = 0;
  local_538[3] = 0;
  local_538[0] = 0;
  local_538[1] = 0;
  ppVar3 = this->m_pParams;
  uVar13 = ppVar3->m_num_pixels;
  if ((ulong)uVar13 != 0) {
    uVar19 = ppVar3->m_alpha_comp_index;
    pcVar4 = ppVar3->m_pPixels;
    puVar5 = ppVar3->m_pSelectors;
    uVar20 = 0;
    do {
      bVar1 = pcVar4[uVar20].field_0.c[uVar19];
      uVar23 = (ulong)puVar5[uVar20];
      local_538[uVar23 + 0x10] = local_538[uVar23 + 0x10] + 1;
      local_538[uVar23 + 8] = local_538[uVar23 + 8] + (ulong)((uint)bVar1 + (uint)bVar1);
      local_538[uVar23] = local_538[uVar23] + (ulong)((uint)bVar1 * (uint)bVar1);
      uVar20 = uVar20 + 1;
    } while (uVar13 != uVar20);
  }
  uVar19 = uVar12 & 0xff;
  uVar13 = uVar16 & 0xff;
  local_458._0_2_ = (ushort)uVar19;
  if (uVar19 == uVar13) {
    if ((uVar12 & 0xff) == 0) {
      local_458._0_2_ = 1;
    }
    else {
      local_458._0_2_ = (ushort)local_458 * 0x101 - 0x100;
    }
  }
  else if (uVar13 < uVar19) {
    local_458._0_2_ = (ushort)(uVar13 << 8) | (ushort)local_458;
  }
  else {
    local_458._0_2_ = (ushort)local_458 * 0x100 + (short)uVar13;
  }
  uVar18 = uVar12 + 0xf5 & 0xff;
  uVar14 = uVar12 + 0xb & 0xff;
  if (0xf3 < uVar19) {
    uVar14 = 0xff;
  }
  if (uVar19 < 0xc) {
    uVar18 = 0;
  }
  uVar20 = 1;
  uVar22 = 1;
  if (uVar18 <= uVar14) {
    uVar21 = uVar16 + 0xf5 & 0xff;
    uVar8 = uVar16 + 0xb & 0xff;
    if (0xf3 < uVar13) {
      uVar8 = 0xff;
    }
    if (uVar13 < 0xc) {
      uVar21 = 0;
    }
    uVar9 = uVar18;
    do {
      if (uVar21 <= uVar8) {
        uVar11 = (ushort)uVar9;
        uVar23 = uVar20;
        iVar17 = uVar21 << 8;
        uVar22 = uVar21;
        uVar2 = uVar11 * 0x100 - 0x100 | uVar11;
        if (uVar9 == 0) {
          uVar2 = 1;
        }
        do {
          uVar20 = uVar23;
          if (((uVar9 <= uVar22 || (uVar22 < uVar18 || uVar8 < uVar9)) &&
              (uVar16 != uVar22 || uVar19 != uVar9)) && (uVar12 != uVar22 || uVar13 != uVar9)) {
            uVar24 = uVar2;
            if (uVar9 != uVar22) {
              if (uVar22 < uVar9) {
                uVar24 = (ushort)iVar17 | uVar11;
              }
              else {
                uVar24 = uVar11 * 0x100 | (ushort)uVar22;
              }
            }
            uVar20 = (ulong)((int)uVar23 + 1);
            *(ushort *)((long)&local_458 + uVar23 * 2) = uVar24;
          }
          uVar22 = uVar22 + 1;
          uVar23 = uVar20;
          iVar17 = iVar17 + 0x100;
        } while (uVar8 + 1 != uVar22);
      }
      uVar22 = (uint)uVar20;
      bVar25 = uVar9 != uVar14;
      uVar9 = uVar9 + 1;
    } while (bVar25);
    if (uVar22 == 0) {
      return;
    }
  }
  uVar20 = 0;
  do {
    uVar2 = *(ushort *)((long)&local_458 + uVar20 * 2);
    dxt5_block::get_block_values8((uint *)(local_538 + 0x18),(uint)(byte)uVar2,(uint)(uVar2 >> 8));
    lVar15 = 0;
    lVar6 = 0;
    lVar7 = 0;
    do {
      uVar23 = *(ulong *)((long)&local_458 + (lVar15 * 2 + -0x10) * 2);
      uVar10 = uVar23 >> 0x20;
      uVar26 = (((local_538[lVar15 + 0x10] >> 0x20) * (uVar23 & 0xffffffff) << 0x20) +
               (local_538[lVar15 + 0x10] & 0xffffffff) * (uVar23 & 0xffffffff)) -
               local_538[lVar15 + 8];
      uVar27 = (((local_538[lVar15 + 0x11] >> 0x20) * uVar10 << 0x20) +
               (local_538[lVar15 + 0x11] & 0xffffffff) * uVar10) - local_538[lVar15 + 9];
      lVar6 = lVar6 + local_538[lVar15] + (uVar26 & 0xffffffff) * (uVar23 & 0xffffffff) +
              ((uVar26 >> 0x20) * (uVar23 & 0xffffffff) << 0x20);
      lVar7 = lVar7 + local_538[lVar15 + 1] + (uVar27 & 0xffffffff) * uVar10 +
              ((uVar27 >> 0x20) * uVar10 << 0x20);
      lVar15 = lVar15 + 2;
    } while (lVar15 != 8);
    if ((ulong)(lVar7 + lVar6) < this->m_pResults->m_error) {
      this->m_pResults->m_low_color = uVar2 & 0xff;
      this->m_pResults->m_high_color = uVar2 >> 8;
      this->m_pResults->m_error = lVar7 + lVar6;
      if (this->m_pResults->m_error == 0) {
        return;
      }
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 != uVar22);
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt5(vec3F low_color, vec3F high_color) {
  uint8 L0 = math::clamp<int>(low_color[0] * 256.0f, 0, 255);
  uint8 H0 = math::clamp<int>(high_color[0] * 256.0f, 0, 255);

  uint64 hist[8] = {}, D2[8] = {}, DD[8] = {};
  for (uint c = m_pParams->m_alpha_comp_index, i = 0; i < m_pParams->m_num_pixels; i++) {
    uint8 a = m_pParams->m_pPixels[i][c];
    uint8 s = m_pParams->m_pSelectors[i];
    hist[s]++;
    D2[s] += a * 2;
    DD[s] += a * a;
  }

  uint16 solutions[529];
  uint solutions_count = 0;
  solutions[solutions_count++] = L0 == H0 ? H0 ? H0 - 1 << 8 | L0 : 1 : L0 > H0 ? H0 << 8 | L0 : L0 << 8 | H0;
  uint8 minL = L0 <= 11 ? 0 : L0 - 11, maxL = L0 >= 244 ? 255 : L0 + 11;
  uint8 minH = H0 <= 11 ? 0 : H0 - 11, maxH = H0 >= 244 ? 255 : H0 + 11;
  for (uint16 L = minL; L <= maxL; L++) {
    for (uint16 H = minH; H <= maxH; H++) {
      if ((maxH < L || L <= H || H < minL) && (L != L0 || H != H0) && (L != H0 || H != L0))
        solutions[solutions_count++] = L == H ? H ? H - 1 << 8 | L : 1 : L > H ? H << 8 | L : L << 8 | H;
    }
  }

  for (uint i = 0; i < solutions_count; i++) {
    uint8 L = solutions[i] & 0xFF;
    uint8 H = solutions[i] >> 8;
    uint values[8];
    dxt5_block::get_block_values8(values, L, H);
    uint64 error = 0;
    for (uint64 s = 0; s < 8; s++)
      error += hist[s] * values[s] * values[s] - D2[s] * values[s] + DD[s];
    if (error < m_pResults->m_error) {
      m_pResults->m_low_color = L;
      m_pResults->m_high_color = H;
      m_pResults->m_error = error;
      if (!m_pResults->m_error)
        return;
    }
  }
}